

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O3

ValueDict * __thiscall MiniScript::Value::GetDict(ValueDict *__return_storage_ptr__,Value *this)

{
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar1;
  
  if (this->type != Map) {
    _Error("Assert failed: type == ValueType::Map",
           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
           ,0x95);
  }
  pDVar1 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)(this->data).ref;
  if (pDVar1 == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
    pDVar1 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x800);
    (pDVar1->super_RefCountedStorage).refCount = 1;
    (pDVar1->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__DictionaryStorage_001bf208;
    memset(&pDVar1->mSize,0,0x7f0);
    (this->data).ref = (RefCountedStorage *)pDVar1;
  }
  __return_storage_ptr__->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
  __return_storage_ptr__->ds = pDVar1;
  __return_storage_ptr__->isTemp = true;
  return __return_storage_ptr__;
}

Assistant:

ValueDict GetDict() { Assert(type == ValueType::Map); if (not data.ref) data.ref = new ValueDictStorage(); ValueDict d((ValueDictStorage*)(data.ref)); d.retain(); return d; }